

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

PacketBuilder * __thiscall PacketBuilder::AddInt(PacketBuilder *this,int num)

{
  undefined1 local_14 [4];
  
  PacketProcessor::ENumber(num);
  std::__cxx11::string::append((char *)&this->data,(ulong)local_14);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddInt(int num)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data.append((char *)PacketProcessor::ENumber(static_cast<unsigned>(num)).data(), 4);

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}